

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

int mbedtls_rsa_pkcs1_sign
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig)

{
  ulong __n;
  byte bVar1;
  int iVar2;
  mbedtls_md_info_t *pmVar3;
  ulong __n_00;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  uchar *input;
  mbedtls_md_context_t mStackY_90;
  uchar auStackY_78 [72];
  
  if (ctx->padding != 1) {
    if (ctx->padding == 0) {
      iVar2 = mbedtls_rsa_rsassa_pkcs1_v15_sign(ctx,f_rng,p_rng,mode,md_alg,hashlen,hash,sig);
      return iVar2;
    }
    return -0x4100;
  }
  if (mode == 1) {
    if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
      return -0x4080;
    }
    if (ctx->padding != 1) {
      return -0x4080;
    }
LAB_0014045e:
    __n = ctx->len;
    if (md_alg != MBEDTLS_MD_NONE) {
      pmVar3 = mbedtls_md_info_from_type(md_alg);
      if (pmVar3 == (mbedtls_md_info_t *)0x0) goto LAB_001404f9;
      bVar1 = mbedtls_md_get_size(pmVar3);
      hashlen = (uint)bVar1;
    }
    pmVar3 = mbedtls_md_info_from_type(ctx->hash_id);
    iVar2 = -0x4080;
    if (pmVar3 != (mbedtls_md_info_t *)0x0) {
      bVar1 = mbedtls_md_get_size(pmVar3);
      __n_00 = (ulong)bVar1;
      if ((uint)bVar1 * 2 + 2 <= __n) {
        memset(sig,0,__n);
        iVar2 = (*f_rng)(p_rng,auStackY_78,__n_00);
        if (iVar2 == 0) {
          sVar4 = mbedtls_mpi_bitlen(&ctx->N);
          lVar6 = __n - (uint)bVar1 * 2;
          sig[lVar6 + -2] = '\x01';
          memcpy(sig + lVar6 + -1,auStackY_78,__n_00);
          mbedtls_md_init(&mStackY_90);
          iVar2 = mbedtls_md_setup(&mStackY_90,pmVar3,0);
          if (iVar2 == 0) {
            input = sig + lVar6 + -1 + __n_00;
            mbedtls_md_starts(&mStackY_90);
            mbedtls_md_update(&mStackY_90,input,8);
            mbedtls_md_update(&mStackY_90,hash,(ulong)hashlen);
            mbedtls_md_update(&mStackY_90,auStackY_78,__n_00);
            mbedtls_md_finish(&mStackY_90,input);
            uVar5 = (ulong)(((int)sVar4 - 1U & 7) == 0);
            mgf_mask(sig + uVar5,(~__n_00 + __n) - uVar5,input,__n_00,&mStackY_90);
            mbedtls_md_free(&mStackY_90);
            sVar4 = mbedtls_mpi_bitlen(&ctx->N);
            *sig = *sig & (byte)(0xff >> (((char)__n * '\b' + '\x01') - (char)sVar4 & 0x1fU));
            input[__n_00] = 0xbc;
            if (mode == 0) {
              iVar2 = mbedtls_rsa_public(ctx,sig,sig);
            }
            else {
              iVar2 = mbedtls_rsa_private(ctx,f_rng,p_rng,sig,sig);
            }
          }
          else {
            mbedtls_md_free(&mStackY_90);
          }
        }
        else {
          iVar2 = iVar2 + -0x4480;
        }
      }
    }
  }
  else {
    if (f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0) goto LAB_0014045e;
LAB_001404f9:
    iVar2 = -0x4080;
  }
  return iVar2;
}

Assistant:

int mbedtls_rsa_pkcs1_sign( mbedtls_rsa_context *ctx,
                    int (*f_rng)(void *, unsigned char *, size_t),
                    void *p_rng,
                    int mode,
                    mbedtls_md_type_t md_alg,
                    unsigned int hashlen,
                    const unsigned char *hash,
                    unsigned char *sig )
{
    switch( ctx->padding )
    {
#if defined(MBEDTLS_PKCS1_V15)
        case MBEDTLS_RSA_PKCS_V15:
            return mbedtls_rsa_rsassa_pkcs1_v15_sign( ctx, f_rng, p_rng, mode, md_alg,
                                              hashlen, hash, sig );
#endif

#if defined(MBEDTLS_PKCS1_V21)
        case MBEDTLS_RSA_PKCS_V21:
            return mbedtls_rsa_rsassa_pss_sign( ctx, f_rng, p_rng, mode, md_alg,
                                        hashlen, hash, sig );
#endif

        default:
            return( MBEDTLS_ERR_RSA_INVALID_PADDING );
    }
}